

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verbose.c
# Opt level: O1

void print_core(int state)

{
  core *pcVar1;
  long lVar2;
  uint *puVar3;
  long lVar4;
  uint uVar5;
  uint *puVar6;
  
  pcVar1 = state_table[state];
  lVar2 = (long)pcVar1->nitems;
  if (0 < lVar2) {
    lVar4 = 0;
    do {
      puVar6 = (uint *)(ritem + pcVar1->items[lVar4]);
      puVar3 = puVar6;
      do {
        uVar5 = *puVar3;
        puVar3 = puVar3 + 1;
      } while (-1 < (int)uVar5);
      uVar5 = -uVar5;
      fprintf((FILE *)verbose_file,"\t%s : ",symbol_name[rlhs[uVar5]]);
      for (puVar3 = (uint *)(ritem + rrhs[uVar5]); puVar3 < puVar6; puVar3 = puVar3 + 1) {
        fprintf((FILE *)verbose_file,"%s ",symbol_name[(int)*puVar3]);
      }
      putc(0x2e,(FILE *)verbose_file);
      uVar5 = *puVar3;
      while (-1 < (int)uVar5) {
        puVar3 = puVar3 + 1;
        fprintf((FILE *)verbose_file," %s",symbol_name[uVar5]);
        uVar5 = *puVar3;
      }
      fprintf((FILE *)verbose_file,"  (%d)\n",(ulong)(-uVar5 - 2));
      lVar4 = lVar4 + 1;
    } while (lVar4 != lVar2);
  }
  return;
}

Assistant:

void print_core(int state)
{
    register int i;
    register int k;
    register int rule;
    register core *statep;
    register Yshort *sp;
    register Yshort *sp1;

    statep = state_table[state];
    k = statep->nitems;

    for (i = 0; i < k; i++)
    {
	sp1 = sp = ritem + statep->items[i];

	while (*sp >= 0) ++sp;
	rule = -(*sp);
	fprintf(verbose_file, "\t%s : ", symbol_name[rlhs[rule]]);

        for (sp = ritem + rrhs[rule]; sp < sp1; sp++)
	    fprintf(verbose_file, "%s ", symbol_name[*sp]);

	putc('.', verbose_file);

	while (*sp >= 0)
	{
	    fprintf(verbose_file, " %s", symbol_name[*sp]);
	    sp++;
	}
	fprintf(verbose_file, "  (%d)\n", -2 - *sp);
    }
}